

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::accessChainLoad
          (Builder *this,Decoration precision,Decoration l_nonUniform,Decoration r_nonUniform,
          Id resultType,MemoryAccessMask memoryAccess,Scope scope,uint alignment)

{
  bool bVar1;
  StorageClass SVar2;
  Id IVar3;
  size_type sVar4;
  reference pvVar5;
  Id local_74;
  Id local_64;
  Id local_60;
  Id swizzledType;
  Id lValue;
  byte local_51;
  int i;
  bool constant;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexes;
  Id local_30;
  Id swizzleBase;
  Id id;
  MemoryAccessMask memoryAccess_local;
  Id resultType_local;
  Decoration r_nonUniform_local;
  Decoration l_nonUniform_local;
  Decoration precision_local;
  Builder *this_local;
  
  if (((this->accessChain).isRValue & 1U) == 0) {
    transferAccessChainSwizzle(this,true);
    SVar2 = getStorageClass(this,(this->accessChain).base);
    swizzleBase = memoryAccess;
    if (SVar2 == PhysicalStorageBuffer) {
      swizzleBase = spv::operator|(memoryAccess,Aligned);
    }
    IVar3 = collapseAccessChain(this);
    addDecoration(this,IVar3,l_nonUniform,-1);
    local_30 = createLoad(this,IVar3,precision,swizzleBase,scope,
                          alignment & (alignment & alignment - 1 ^ 0xffffffff));
    addDecoration(this,local_30,r_nonUniform,-1);
  }
  else {
    transferAccessChainSwizzle(this,false);
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (&(this->accessChain).indexChain);
    if (sVar4 == 0) {
      local_30 = (this->accessChain).base;
    }
    else {
      local_74 = resultType;
      if ((this->accessChain).preSwizzleBaseType != 0) {
        local_74 = (this->accessChain).preSwizzleBaseType;
      }
      indexes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = local_74;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
      local_51 = 1;
      for (lValue = 0; IVar3 = lValue,
          sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            (&(this->accessChain).indexChain), (int)IVar3 < (int)sVar4;
          lValue = lValue + 1) {
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&(this->accessChain).indexChain,(long)(int)lValue);
        bVar1 = isConstantScalar(this,*pvVar5);
        if (!bVar1) {
          local_51 = 0;
          break;
        }
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&(this->accessChain).indexChain,(long)(int)lValue);
        swizzledType = getConstantScalar(this,*pvVar5);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,&swizzledType);
      }
      if ((local_51 & 1) == 0) {
        bVar1 = isCooperativeVector(this,(this->accessChain).base);
        if (bVar1) {
          sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            (&(this->accessChain).indexChain);
          if (sVar4 != 1) {
            __assert_fail("accessChain.indexChain.size() == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                          ,0xfde,
                          "Id spv::Builder::accessChainLoad(Decoration, Decoration, Decoration, Id, spv::MemoryAccessMask, spv::Scope, unsigned int)"
                         );
          }
          IVar3 = (this->accessChain).base;
          pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&(this->accessChain).indexChain,0);
          local_30 = createVectorExtractDynamic(this,IVar3,resultType,*pvVar5);
        }
        else {
          if ((this->spvVersion < 0x10400) ||
             (bVar1 = isValidInitializer(this,(this->accessChain).base), !bVar1)) {
            IVar3 = getTypeId(this,(this->accessChain).base);
            local_60 = createVariable(this,DecorationMax,Function,IVar3,"indexable",0,true);
            createStore(this,(this->accessChain).base,local_60,MaskNone,Max,0);
          }
          else {
            IVar3 = getTypeId(this,(this->accessChain).base);
            local_60 = createVariable(this,DecorationMax,Function,IVar3,"indexable",
                                      (this->accessChain).base,true);
            addDecoration(this,local_60,DecorationNonWritable,-1);
          }
          (this->accessChain).base = local_60;
          (this->accessChain).isRValue = false;
          IVar3 = collapseAccessChain(this);
          local_30 = createLoad(this,IVar3,precision,MaskNone,Max,0);
        }
      }
      else {
        local_30 = createCompositeExtract
                             (this,(this->accessChain).base,
                              indexes.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
        setPrecision(this,local_30,precision);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
    }
  }
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    (&(this->accessChain).swizzle);
  if ((sVar4 == 0) && ((this->accessChain).component == 0)) {
    this_local._4_4_ = local_30;
  }
  else {
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (&(this->accessChain).swizzle);
    if (sVar4 != 0) {
      IVar3 = getTypeId(this,local_30);
      local_64 = getScalarTypeId(this,IVar3);
      sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        (&(this->accessChain).swizzle);
      if (1 < sVar4) {
        sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          (&(this->accessChain).swizzle);
        local_64 = makeVectorType(this,local_64,(int)sVar4);
      }
      local_30 = createRvalueSwizzle(this,precision,local_64,local_30,&(this->accessChain).swizzle);
    }
    if ((this->accessChain).component != 0) {
      IVar3 = createVectorExtractDynamic(this,local_30,resultType,(this->accessChain).component);
      local_30 = setPrecision(this,IVar3,precision);
    }
    addDecoration(this,local_30,r_nonUniform,-1);
    this_local._4_4_ = local_30;
  }
  return this_local._4_4_;
}

Assistant:

Id Builder::accessChainLoad(Decoration precision, Decoration l_nonUniform,
    Decoration r_nonUniform, Id resultType, spv::MemoryAccessMask memoryAccess,
    spv::Scope scope, unsigned int alignment)
{
    Id id;

    if (accessChain.isRValue) {
        // transfer access chain, but try to stay in registers
        transferAccessChainSwizzle(false);
        if (accessChain.indexChain.size() > 0) {
            Id swizzleBase = accessChain.preSwizzleBaseType != NoType ? accessChain.preSwizzleBaseType : resultType;

            // if all the accesses are constants, we can use OpCompositeExtract
            std::vector<unsigned> indexes;
            bool constant = true;
            for (int i = 0; i < (int)accessChain.indexChain.size(); ++i) {
                if (isConstantScalar(accessChain.indexChain[i]))
                    indexes.push_back(getConstantScalar(accessChain.indexChain[i]));
                else {
                    constant = false;
                    break;
                }
            }

            if (constant) {
                id = createCompositeExtract(accessChain.base, swizzleBase, indexes);
                setPrecision(id, precision);
            } else if (isCooperativeVector(accessChain.base)) {
                assert(accessChain.indexChain.size() == 1);
                id = createVectorExtractDynamic(accessChain.base, resultType, accessChain.indexChain[0]);
            } else {
                Id lValue = NoResult;
                if (spvVersion >= Spv_1_4 && isValidInitializer(accessChain.base)) {
                    // make a new function variable for this r-value, using an initializer,
                    // and mark it as NonWritable so that downstream it can be detected as a lookup
                    // table
                    lValue = createVariable(NoPrecision, StorageClassFunction, getTypeId(accessChain.base),
                        "indexable", accessChain.base);
                    addDecoration(lValue, DecorationNonWritable);
                } else {
                    lValue = createVariable(NoPrecision, StorageClassFunction, getTypeId(accessChain.base),
                        "indexable");
                    // store into it
                    createStore(accessChain.base, lValue);
                }
                // move base to the new variable
                accessChain.base = lValue;
                accessChain.isRValue = false;

                // load through the access chain
                id = createLoad(collapseAccessChain(), precision);
            }
        } else
            id = accessChain.base;  // no precision, it was set when this was defined
    } else {
        transferAccessChainSwizzle(true);

        // take LSB of alignment
        alignment = alignment & ~(alignment & (alignment-1));
        if (getStorageClass(accessChain.base) == StorageClassPhysicalStorageBufferEXT) {
            memoryAccess = (spv::MemoryAccessMask)(memoryAccess | spv::MemoryAccessAlignedMask);
        }

        // load through the access chain
        id = collapseAccessChain();
        // Apply nonuniform both to the access chain and the loaded value.
        // Buffer accesses need the access chain decorated, and this is where
        // loaded image types get decorated. TODO: This should maybe move to
        // createImageTextureFunctionCall.
        addDecoration(id, l_nonUniform);
        id = createLoad(id, precision, memoryAccess, scope, alignment);
        addDecoration(id, r_nonUniform);
    }

    // Done, unless there are swizzles to do
    if (accessChain.swizzle.size() == 0 && accessChain.component == NoResult)
        return id;

    // Do remaining swizzling

    // Do the basic swizzle
    if (accessChain.swizzle.size() > 0) {
        Id swizzledType = getScalarTypeId(getTypeId(id));
        if (accessChain.swizzle.size() > 1)
            swizzledType = makeVectorType(swizzledType, (int)accessChain.swizzle.size());
        id = createRvalueSwizzle(precision, swizzledType, id, accessChain.swizzle);
    }

    // Do the dynamic component
    if (accessChain.component != NoResult)
        id = setPrecision(createVectorExtractDynamic(id, resultType, accessChain.component), precision);

    addDecoration(id, r_nonUniform);
    return id;
}